

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabb.hpp
# Opt level: O3

void __thiscall Character::Character(Character *this,vec2 center,vec2 halfDimension)

{
  undefined8 *puVar1;
  AABB AVar2;
  long lVar3;
  
  AVar2.halfDimension.field_0.field_0.x = (float)halfDimension.field_0._0_4_;
  AVar2.center = (vec2)(vec2)center.field_0;
  AVar2.halfDimension.field_0.field_0.y = (float)halfDimension.field_0._4_4_;
  this->super_AABB = AVar2;
  lVar3 = 0;
  do {
    puVar1 = (undefined8 *)
             ((long)&this->animations[0].frames.
                     super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)&this->animations[0].frames.
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar3) = 0;
    *(undefined8 *)((long)&this->animations[0].millisPerFrame + lVar3) = 100;
    *(undefined4 *)((long)&this->animations[0].lastMillis + lVar3) = 0;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0xf0);
  this->state = IDLE;
  this->towardsLeft = false;
  this->grounded = false;
  (this->velocity).field_0 = (anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  (this->runAcceleration).field_0 =
       (anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  *(undefined8 *)((long)&(this->runAcceleration).field_0 + 1) = 0;
  *(undefined8 *)((long)&(this->jumpAcceleration).field_0 + 1) = 0;
  this->timeOfDeathInMillis = -1;
  this->lives = 3;
  (this->bluePortal).super_AABB.center.field_0 =
       (anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  (this->bluePortal).super_AABB.halfDimension.field_0 =
       (anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  (this->bluePortal).animation.frames.
  super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bluePortal).animation.frames.
  super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bluePortal).animation.frames.
  super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bluePortal).animation.millisPerFrame = 100;
  (this->bluePortal).animation.frameIndex = 0;
  (this->bluePortal).animation.lastMillis = 0;
  (this->bluePortal).flipVertically = true;
  (this->bluePortal).state = CLOSED;
  (this->bluePortal).scale = 0.0;
  *(undefined8 *)&(this->bluePortal).timer = 0;
  *(undefined8 *)((long)&(this->orangePortal).super_AABB.center.field_0 + 4) = 0;
  *(undefined8 *)((long)&(this->orangePortal).super_AABB.halfDimension.field_0 + 4) = 0;
  *(undefined8 *)
   ((long)&(this->orangePortal).animation.frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->orangePortal).animation.frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined4 *)
   ((long)&(this->orangePortal).animation.frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->orangePortal).animation.millisPerFrame = 100;
  (this->orangePortal).animation.frameIndex = 0;
  (this->orangePortal).animation.lastMillis = 0;
  (this->orangePortal).flipVertically = false;
  (this->orangePortal).state = CLOSED;
  (this->orangePortal).scale = 0.0;
  (this->orangePortal).timer.startTimeInMillis = 0;
  return;
}

Assistant:

AABB(glm::vec2 center, glm::vec2 halfDimension)
        : center(center)
        , halfDimension(halfDimension) {
    }